

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

MaybeResult<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
plaininstr<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (MaybeResult<wasm::WATParser::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  bool bVar1;
  Index pos_00;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  const_pointer __src;
  size_type __n;
  MaybeResult<wasm::WATParser::Ok> *pMVar3;
  allocator<char> aStack_16e89;
  string sStack_16e88;
  Err aEStack_16e68 [2];
  Err *err_607;
  Result<wasm::WATParser::Ok> _val_607;
  Result<wasm::WATParser::Ok> ret_607;
  Err *err_606;
  Result<wasm::WATParser::Ok> _val_606;
  Result<wasm::WATParser::Ok> ret_606;
  Err *err_605;
  Result<wasm::WATParser::Ok> _val_605;
  Result<wasm::WATParser::Ok> ret_605;
  Err *err_604;
  Result<wasm::WATParser::Ok> _val_604;
  Result<wasm::WATParser::Ok> ret_604;
  Err *err_603;
  Result<wasm::WATParser::Ok> _val_603;
  Result<wasm::WATParser::Ok> ret_603;
  Err *err_602;
  Result<wasm::WATParser::Ok> _val_602;
  Result<wasm::WATParser::Ok> ret_602;
  Err *err_601;
  Result<wasm::WATParser::Ok> _val_601;
  Result<wasm::WATParser::Ok> ret_601;
  Err *err_600;
  Result<wasm::WATParser::Ok> _val_600;
  Result<wasm::WATParser::Ok> ret_600;
  Err *err_599;
  Result<wasm::WATParser::Ok> _val_599;
  Result<wasm::WATParser::Ok> ret_599;
  Err *err_598;
  Result<wasm::WATParser::Ok> _val_598;
  Result<wasm::WATParser::Ok> ret_598;
  Err *err_597;
  Result<wasm::WATParser::Ok> _val_597;
  Result<wasm::WATParser::Ok> ret_597;
  Err *err_596;
  Result<wasm::WATParser::Ok> _val_596;
  Result<wasm::WATParser::Ok> ret_596;
  Err *err_595;
  Result<wasm::WATParser::Ok> _val_595;
  Result<wasm::WATParser::Ok> ret_595;
  Err *err_594;
  Result<wasm::WATParser::Ok> _val_594;
  Result<wasm::WATParser::Ok> ret_594;
  Err *err_593;
  Result<wasm::WATParser::Ok> _val_593;
  Result<wasm::WATParser::Ok> ret_593;
  Err *err_592;
  Result<wasm::WATParser::Ok> _val_592;
  Result<wasm::WATParser::Ok> ret_592;
  Err *err_591;
  Result<wasm::WATParser::Ok> _val_591;
  Result<wasm::WATParser::Ok> ret_591;
  Err *err_590;
  Result<wasm::WATParser::Ok> _val_590;
  Result<wasm::WATParser::Ok> ret_590;
  Err *err_589;
  Result<wasm::WATParser::Ok> _val_589;
  Result<wasm::WATParser::Ok> ret_589;
  Err *err_588;
  Result<wasm::WATParser::Ok> _val_588;
  Result<wasm::WATParser::Ok> ret_588;
  Err *err_587;
  Result<wasm::WATParser::Ok> _val_587;
  Result<wasm::WATParser::Ok> ret_587;
  Err *err_586;
  Result<wasm::WATParser::Ok> _val_586;
  Result<wasm::WATParser::Ok> ret_586;
  Err *err_585;
  Result<wasm::WATParser::Ok> _val_585;
  Result<wasm::WATParser::Ok> ret_585;
  Err *err_584;
  Result<wasm::WATParser::Ok> _val_584;
  Result<wasm::WATParser::Ok> ret_584;
  Err *err_583;
  Result<wasm::WATParser::Ok> _val_583;
  Result<wasm::WATParser::Ok> ret_583;
  Err *err_582;
  Result<wasm::WATParser::Ok> _val_582;
  Result<wasm::WATParser::Ok> ret_582;
  Err *err_581;
  Result<wasm::WATParser::Ok> _val_581;
  Result<wasm::WATParser::Ok> ret_581;
  Err *err_580;
  Result<wasm::WATParser::Ok> _val_580;
  Result<wasm::WATParser::Ok> ret_580;
  Err *err_579;
  Result<wasm::WATParser::Ok> _val_579;
  Result<wasm::WATParser::Ok> ret_579;
  Err *err_578;
  Result<wasm::WATParser::Ok> _val_578;
  Result<wasm::WATParser::Ok> ret_578;
  Err *err_577;
  Result<wasm::WATParser::Ok> _val_577;
  Result<wasm::WATParser::Ok> ret_577;
  Err *err_576;
  Result<wasm::WATParser::Ok> _val_576;
  Result<wasm::WATParser::Ok> ret_576;
  Err *err_575;
  Result<wasm::WATParser::Ok> _val_575;
  Result<wasm::WATParser::Ok> ret_575;
  Err *err_574;
  Result<wasm::WATParser::Ok> _val_574;
  Result<wasm::WATParser::Ok> ret_574;
  Err *err_573;
  Result<wasm::WATParser::Ok> _val_573;
  Result<wasm::WATParser::Ok> ret_573;
  Err *err_572;
  Result<wasm::WATParser::Ok> _val_572;
  Result<wasm::WATParser::Ok> ret_572;
  Err *err_571;
  Result<wasm::WATParser::Ok> _val_571;
  Result<wasm::WATParser::Ok> ret_571;
  Err *err_570;
  Result<wasm::WATParser::Ok> _val_570;
  Result<wasm::WATParser::Ok> ret_570;
  Err *err_569;
  Result<wasm::WATParser::Ok> _val_569;
  Result<wasm::WATParser::Ok> ret_569;
  Err *err_568;
  Result<wasm::WATParser::Ok> _val_568;
  Result<wasm::WATParser::Ok> ret_568;
  Err *err_567;
  Result<wasm::WATParser::Ok> _val_567;
  Result<wasm::WATParser::Ok> ret_567;
  Err *err_566;
  Result<wasm::WATParser::Ok> _val_566;
  Result<wasm::WATParser::Ok> ret_566;
  Err *err_565;
  Result<wasm::WATParser::Ok> _val_565;
  Result<wasm::WATParser::Ok> ret_565;
  Err *err_564;
  Result<wasm::WATParser::Ok> _val_564;
  Result<wasm::WATParser::Ok> ret_564;
  Err *err_563;
  Result<wasm::WATParser::Ok> _val_563;
  Result<wasm::WATParser::Ok> ret_563;
  Err *err_562;
  Result<wasm::WATParser::Ok> _val_562;
  Result<wasm::WATParser::Ok> ret_562;
  Err *err_561;
  Result<wasm::WATParser::Ok> _val_561;
  Result<wasm::WATParser::Ok> ret_561;
  Err *err_560;
  Result<wasm::WATParser::Ok> _val_560;
  Result<wasm::WATParser::Ok> ret_560;
  Err *err_559;
  Result<wasm::WATParser::Ok> _val_559;
  Result<wasm::WATParser::Ok> ret_559;
  Err *err_558;
  Result<wasm::WATParser::Ok> _val_558;
  Result<wasm::WATParser::Ok> ret_558;
  Err *err_557;
  Result<wasm::WATParser::Ok> _val_557;
  Result<wasm::WATParser::Ok> ret_557;
  Err *err_556;
  Result<wasm::WATParser::Ok> _val_556;
  Result<wasm::WATParser::Ok> ret_556;
  Err *err_555;
  Result<wasm::WATParser::Ok> _val_555;
  Result<wasm::WATParser::Ok> ret_555;
  Err *err_554;
  Result<wasm::WATParser::Ok> _val_554;
  Result<wasm::WATParser::Ok> ret_554;
  Err *err_553;
  Result<wasm::WATParser::Ok> _val_553;
  Result<wasm::WATParser::Ok> ret_553;
  Err *err_552;
  Result<wasm::WATParser::Ok> _val_552;
  Result<wasm::WATParser::Ok> ret_552;
  Err *err_551;
  Result<wasm::WATParser::Ok> _val_551;
  Result<wasm::WATParser::Ok> ret_551;
  Err *err_550;
  Result<wasm::WATParser::Ok> _val_550;
  Result<wasm::WATParser::Ok> ret_550;
  Err *err_549;
  Result<wasm::WATParser::Ok> _val_549;
  Result<wasm::WATParser::Ok> ret_549;
  Err *err_548;
  Result<wasm::WATParser::Ok> _val_548;
  Result<wasm::WATParser::Ok> ret_548;
  Err *err_547;
  Result<wasm::WATParser::Ok> _val_547;
  Result<wasm::WATParser::Ok> ret_547;
  Err *err_546;
  Result<wasm::WATParser::Ok> _val_546;
  Result<wasm::WATParser::Ok> ret_546;
  Err *err_545;
  Result<wasm::WATParser::Ok> _val_545;
  Result<wasm::WATParser::Ok> ret_545;
  Err *err_544;
  Result<wasm::WATParser::Ok> _val_544;
  Result<wasm::WATParser::Ok> ret_544;
  Err *err_543;
  Result<wasm::WATParser::Ok> _val_543;
  Result<wasm::WATParser::Ok> ret_543;
  Err *err_542;
  Result<wasm::WATParser::Ok> _val_542;
  Result<wasm::WATParser::Ok> ret_542;
  Err *err_541;
  Result<wasm::WATParser::Ok> _val_541;
  Result<wasm::WATParser::Ok> ret_541;
  Err *err_540;
  Result<wasm::WATParser::Ok> _val_540;
  Result<wasm::WATParser::Ok> ret_540;
  Err *err_539;
  Result<wasm::WATParser::Ok> _val_539;
  Result<wasm::WATParser::Ok> ret_539;
  Err *err_538;
  Result<wasm::WATParser::Ok> _val_538;
  Result<wasm::WATParser::Ok> ret_538;
  Err *err_537;
  Result<wasm::WATParser::Ok> _val_537;
  Result<wasm::WATParser::Ok> ret_537;
  Err *err_536;
  Result<wasm::WATParser::Ok> _val_536;
  Result<wasm::WATParser::Ok> ret_536;
  Err *err_535;
  Result<wasm::WATParser::Ok> _val_535;
  Result<wasm::WATParser::Ok> ret_535;
  Err *err_534;
  Result<wasm::WATParser::Ok> _val_534;
  Result<wasm::WATParser::Ok> ret_534;
  Err *err_533;
  Result<wasm::WATParser::Ok> _val_533;
  Result<wasm::WATParser::Ok> ret_533;
  Err *err_532;
  Result<wasm::WATParser::Ok> _val_532;
  Result<wasm::WATParser::Ok> ret_532;
  Err *err_531;
  Result<wasm::WATParser::Ok> _val_531;
  Result<wasm::WATParser::Ok> ret_531;
  Err *err_530;
  Result<wasm::WATParser::Ok> _val_530;
  Result<wasm::WATParser::Ok> ret_530;
  Err *err_529;
  Result<wasm::WATParser::Ok> _val_529;
  Result<wasm::WATParser::Ok> ret_529;
  Err *err_528;
  Result<wasm::WATParser::Ok> _val_528;
  Result<wasm::WATParser::Ok> ret_528;
  Err *err_527;
  Result<wasm::WATParser::Ok> _val_527;
  Result<wasm::WATParser::Ok> ret_527;
  Err *err_526;
  Result<wasm::WATParser::Ok> _val_526;
  Result<wasm::WATParser::Ok> ret_526;
  Err *err_525;
  Result<wasm::WATParser::Ok> _val_525;
  Result<wasm::WATParser::Ok> ret_525;
  Err *err_524;
  Result<wasm::WATParser::Ok> _val_524;
  Result<wasm::WATParser::Ok> ret_524;
  Err *err_523;
  Result<wasm::WATParser::Ok> _val_523;
  Result<wasm::WATParser::Ok> ret_523;
  Err *err_522;
  Result<wasm::WATParser::Ok> _val_522;
  Result<wasm::WATParser::Ok> ret_522;
  Err *err_521;
  Result<wasm::WATParser::Ok> _val_521;
  Result<wasm::WATParser::Ok> ret_521;
  Err *err_520;
  Result<wasm::WATParser::Ok> _val_520;
  Result<wasm::WATParser::Ok> ret_520;
  Err *err_519;
  Result<wasm::WATParser::Ok> _val_519;
  Result<wasm::WATParser::Ok> ret_519;
  Err *err_518;
  Result<wasm::WATParser::Ok> _val_518;
  Result<wasm::WATParser::Ok> ret_518;
  Err *err_517;
  Result<wasm::WATParser::Ok> _val_517;
  Result<wasm::WATParser::Ok> ret_517;
  Err *err_516;
  Result<wasm::WATParser::Ok> _val_516;
  Result<wasm::WATParser::Ok> ret_516;
  Err *err_515;
  Result<wasm::WATParser::Ok> _val_515;
  Result<wasm::WATParser::Ok> ret_515;
  Err *err_514;
  Result<wasm::WATParser::Ok> _val_514;
  Result<wasm::WATParser::Ok> ret_514;
  Err *err_513;
  Result<wasm::WATParser::Ok> _val_513;
  Result<wasm::WATParser::Ok> ret_513;
  Err *err_512;
  Result<wasm::WATParser::Ok> _val_512;
  Result<wasm::WATParser::Ok> ret_512;
  Err *err_511;
  Result<wasm::WATParser::Ok> _val_511;
  Result<wasm::WATParser::Ok> ret_511;
  Err *err_510;
  Result<wasm::WATParser::Ok> _val_510;
  Result<wasm::WATParser::Ok> ret_510;
  Err *err_509;
  Result<wasm::WATParser::Ok> _val_509;
  Result<wasm::WATParser::Ok> ret_509;
  Err *err_508;
  Result<wasm::WATParser::Ok> _val_508;
  Result<wasm::WATParser::Ok> ret_508;
  Err *err_507;
  Result<wasm::WATParser::Ok> _val_507;
  Result<wasm::WATParser::Ok> ret_507;
  Err *err_506;
  Result<wasm::WATParser::Ok> _val_506;
  Result<wasm::WATParser::Ok> ret_506;
  Err *err_505;
  Result<wasm::WATParser::Ok> _val_505;
  Result<wasm::WATParser::Ok> ret_505;
  Err *err_504;
  Result<wasm::WATParser::Ok> _val_504;
  Result<wasm::WATParser::Ok> ret_504;
  Err *err_503;
  Result<wasm::WATParser::Ok> _val_503;
  Result<wasm::WATParser::Ok> ret_503;
  Err *err_502;
  Result<wasm::WATParser::Ok> _val_502;
  Result<wasm::WATParser::Ok> ret_502;
  Err *err_501;
  Result<wasm::WATParser::Ok> _val_501;
  Result<wasm::WATParser::Ok> ret_501;
  Err *err_500;
  Result<wasm::WATParser::Ok> _val_500;
  Result<wasm::WATParser::Ok> ret_500;
  Err *err_499;
  Result<wasm::WATParser::Ok> _val_499;
  Result<wasm::WATParser::Ok> ret_499;
  Err *err_498;
  Result<wasm::WATParser::Ok> _val_498;
  Result<wasm::WATParser::Ok> ret_498;
  Err *err_497;
  Result<wasm::WATParser::Ok> _val_497;
  Result<wasm::WATParser::Ok> ret_497;
  Err *err_496;
  Result<wasm::WATParser::Ok> _val_496;
  Result<wasm::WATParser::Ok> ret_496;
  Err *err_495;
  Result<wasm::WATParser::Ok> _val_495;
  Result<wasm::WATParser::Ok> ret_495;
  Err *err_494;
  Result<wasm::WATParser::Ok> _val_494;
  Result<wasm::WATParser::Ok> ret_494;
  Err *err_493;
  Result<wasm::WATParser::Ok> _val_493;
  Result<wasm::WATParser::Ok> ret_493;
  Err *err_492;
  Result<wasm::WATParser::Ok> _val_492;
  Result<wasm::WATParser::Ok> ret_492;
  Err *err_491;
  Result<wasm::WATParser::Ok> _val_491;
  Result<wasm::WATParser::Ok> ret_491;
  Err *err_490;
  Result<wasm::WATParser::Ok> _val_490;
  Result<wasm::WATParser::Ok> ret_490;
  Err *err_489;
  Result<wasm::WATParser::Ok> _val_489;
  Result<wasm::WATParser::Ok> ret_489;
  Err *err_488;
  Result<wasm::WATParser::Ok> _val_488;
  Result<wasm::WATParser::Ok> ret_488;
  Err *err_487;
  Result<wasm::WATParser::Ok> _val_487;
  Result<wasm::WATParser::Ok> ret_487;
  Err *err_486;
  Result<wasm::WATParser::Ok> _val_486;
  Result<wasm::WATParser::Ok> ret_486;
  Err *err_485;
  Result<wasm::WATParser::Ok> _val_485;
  Result<wasm::WATParser::Ok> ret_485;
  Err *err_484;
  Result<wasm::WATParser::Ok> _val_484;
  Result<wasm::WATParser::Ok> ret_484;
  Err *err_483;
  Result<wasm::WATParser::Ok> _val_483;
  Result<wasm::WATParser::Ok> ret_483;
  Err *err_482;
  Result<wasm::WATParser::Ok> _val_482;
  Result<wasm::WATParser::Ok> ret_482;
  Err *err_481;
  Result<wasm::WATParser::Ok> _val_481;
  Result<wasm::WATParser::Ok> ret_481;
  Err *err_480;
  Result<wasm::WATParser::Ok> _val_480;
  Result<wasm::WATParser::Ok> ret_480;
  Err *err_479;
  Result<wasm::WATParser::Ok> _val_479;
  Result<wasm::WATParser::Ok> ret_479;
  Err *err_478;
  Result<wasm::WATParser::Ok> _val_478;
  Result<wasm::WATParser::Ok> ret_478;
  Err *err_477;
  Result<wasm::WATParser::Ok> _val_477;
  Result<wasm::WATParser::Ok> ret_477;
  Err *err_476;
  Result<wasm::WATParser::Ok> _val_476;
  Result<wasm::WATParser::Ok> ret_476;
  Err *err_475;
  Result<wasm::WATParser::Ok> _val_475;
  Result<wasm::WATParser::Ok> ret_475;
  Err *err_474;
  Result<wasm::WATParser::Ok> _val_474;
  Result<wasm::WATParser::Ok> ret_474;
  Err *err_473;
  Result<wasm::WATParser::Ok> _val_473;
  Result<wasm::WATParser::Ok> ret_473;
  Err *err_472;
  Result<wasm::WATParser::Ok> _val_472;
  Result<wasm::WATParser::Ok> ret_472;
  Err *err_471;
  Result<wasm::WATParser::Ok> _val_471;
  Result<wasm::WATParser::Ok> ret_471;
  Err *err_470;
  Result<wasm::WATParser::Ok> _val_470;
  Result<wasm::WATParser::Ok> ret_470;
  Err *err_469;
  Result<wasm::WATParser::Ok> _val_469;
  Result<wasm::WATParser::Ok> ret_469;
  Err *err_468;
  Result<wasm::WATParser::Ok> _val_468;
  Result<wasm::WATParser::Ok> ret_468;
  Err *err_467;
  Result<wasm::WATParser::Ok> _val_467;
  Result<wasm::WATParser::Ok> ret_467;
  Err *err_466;
  Result<wasm::WATParser::Ok> _val_466;
  Result<wasm::WATParser::Ok> ret_466;
  Err *err_465;
  Result<wasm::WATParser::Ok> _val_465;
  Result<wasm::WATParser::Ok> ret_465;
  Err *err_464;
  Result<wasm::WATParser::Ok> _val_464;
  Result<wasm::WATParser::Ok> ret_464;
  Err *err_463;
  Result<wasm::WATParser::Ok> _val_463;
  Result<wasm::WATParser::Ok> ret_463;
  Err *err_462;
  Result<wasm::WATParser::Ok> _val_462;
  Result<wasm::WATParser::Ok> ret_462;
  Err *err_461;
  Result<wasm::WATParser::Ok> _val_461;
  Result<wasm::WATParser::Ok> ret_461;
  Err *err_460;
  Result<wasm::WATParser::Ok> _val_460;
  Result<wasm::WATParser::Ok> ret_460;
  Err *err_459;
  Result<wasm::WATParser::Ok> _val_459;
  Result<wasm::WATParser::Ok> ret_459;
  Err *err_458;
  Result<wasm::WATParser::Ok> _val_458;
  Result<wasm::WATParser::Ok> ret_458;
  Err *err_457;
  Result<wasm::WATParser::Ok> _val_457;
  Result<wasm::WATParser::Ok> ret_457;
  Err *err_456;
  Result<wasm::WATParser::Ok> _val_456;
  Result<wasm::WATParser::Ok> ret_456;
  Err *err_455;
  Result<wasm::WATParser::Ok> _val_455;
  Result<wasm::WATParser::Ok> ret_455;
  Err *err_454;
  Result<wasm::WATParser::Ok> _val_454;
  Result<wasm::WATParser::Ok> ret_454;
  Err *err_453;
  Result<wasm::WATParser::Ok> _val_453;
  Result<wasm::WATParser::Ok> ret_453;
  Err *err_452;
  Result<wasm::WATParser::Ok> _val_452;
  Result<wasm::WATParser::Ok> ret_452;
  Err *err_451;
  Result<wasm::WATParser::Ok> _val_451;
  Result<wasm::WATParser::Ok> ret_451;
  Err *err_450;
  Result<wasm::WATParser::Ok> _val_450;
  Result<wasm::WATParser::Ok> ret_450;
  Err *err_449;
  Result<wasm::WATParser::Ok> _val_449;
  Result<wasm::WATParser::Ok> ret_449;
  Err *err_448;
  Result<wasm::WATParser::Ok> _val_448;
  Result<wasm::WATParser::Ok> ret_448;
  Err *err_447;
  Result<wasm::WATParser::Ok> _val_447;
  Result<wasm::WATParser::Ok> ret_447;
  Err *err_446;
  Result<wasm::WATParser::Ok> _val_446;
  Result<wasm::WATParser::Ok> ret_446;
  Err *err_445;
  Result<wasm::WATParser::Ok> _val_445;
  Result<wasm::WATParser::Ok> ret_445;
  Err *err_444;
  Result<wasm::WATParser::Ok> _val_444;
  Result<wasm::WATParser::Ok> ret_444;
  Err *err_443;
  Result<wasm::WATParser::Ok> _val_443;
  Result<wasm::WATParser::Ok> ret_443;
  Err *err_442;
  Result<wasm::WATParser::Ok> _val_442;
  Result<wasm::WATParser::Ok> ret_442;
  Err *err_441;
  Result<wasm::WATParser::Ok> _val_441;
  Result<wasm::WATParser::Ok> ret_441;
  Err *err_440;
  Result<wasm::WATParser::Ok> _val_440;
  Result<wasm::WATParser::Ok> ret_440;
  Err *err_439;
  Result<wasm::WATParser::Ok> _val_439;
  Result<wasm::WATParser::Ok> ret_439;
  Err *err_438;
  Result<wasm::WATParser::Ok> _val_438;
  Result<wasm::WATParser::Ok> ret_438;
  Err *err_437;
  Result<wasm::WATParser::Ok> _val_437;
  Result<wasm::WATParser::Ok> ret_437;
  Err *err_436;
  Result<wasm::WATParser::Ok> _val_436;
  Result<wasm::WATParser::Ok> ret_436;
  Err *err_435;
  Result<wasm::WATParser::Ok> _val_435;
  Result<wasm::WATParser::Ok> ret_435;
  Err *err_434;
  Result<wasm::WATParser::Ok> _val_434;
  Result<wasm::WATParser::Ok> ret_434;
  Err *err_433;
  Result<wasm::WATParser::Ok> _val_433;
  Result<wasm::WATParser::Ok> ret_433;
  Err *err_432;
  Result<wasm::WATParser::Ok> _val_432;
  Result<wasm::WATParser::Ok> ret_432;
  Err *err_431;
  Result<wasm::WATParser::Ok> _val_431;
  Result<wasm::WATParser::Ok> ret_431;
  Err *err_430;
  Result<wasm::WATParser::Ok> _val_430;
  Result<wasm::WATParser::Ok> ret_430;
  Err *err_429;
  Result<wasm::WATParser::Ok> _val_429;
  Result<wasm::WATParser::Ok> ret_429;
  Err *err_428;
  Result<wasm::WATParser::Ok> _val_428;
  Result<wasm::WATParser::Ok> ret_428;
  Err *err_427;
  Result<wasm::WATParser::Ok> _val_427;
  Result<wasm::WATParser::Ok> ret_427;
  Err *err_426;
  Result<wasm::WATParser::Ok> _val_426;
  Result<wasm::WATParser::Ok> ret_426;
  Err *err_425;
  Result<wasm::WATParser::Ok> _val_425;
  Result<wasm::WATParser::Ok> ret_425;
  Err *err_424;
  Result<wasm::WATParser::Ok> _val_424;
  Result<wasm::WATParser::Ok> ret_424;
  Err *err_423;
  Result<wasm::WATParser::Ok> _val_423;
  Result<wasm::WATParser::Ok> ret_423;
  Err *err_422;
  Result<wasm::WATParser::Ok> _val_422;
  Result<wasm::WATParser::Ok> ret_422;
  Err *err_421;
  Result<wasm::WATParser::Ok> _val_421;
  Result<wasm::WATParser::Ok> ret_421;
  Err *err_420;
  Result<wasm::WATParser::Ok> _val_420;
  Result<wasm::WATParser::Ok> ret_420;
  Err *err_419;
  Result<wasm::WATParser::Ok> _val_419;
  Result<wasm::WATParser::Ok> ret_419;
  Err *err_418;
  Result<wasm::WATParser::Ok> _val_418;
  Result<wasm::WATParser::Ok> ret_418;
  Err *err_417;
  Result<wasm::WATParser::Ok> _val_417;
  Result<wasm::WATParser::Ok> ret_417;
  Err *err_416;
  Result<wasm::WATParser::Ok> _val_416;
  Result<wasm::WATParser::Ok> ret_416;
  Err *err_415;
  Result<wasm::WATParser::Ok> _val_415;
  Result<wasm::WATParser::Ok> ret_415;
  Err *err_414;
  Result<wasm::WATParser::Ok> _val_414;
  Result<wasm::WATParser::Ok> ret_414;
  Err *err_413;
  Result<wasm::WATParser::Ok> _val_413;
  Result<wasm::WATParser::Ok> ret_413;
  Err *err_412;
  Result<wasm::WATParser::Ok> _val_412;
  Result<wasm::WATParser::Ok> ret_412;
  Err *err_411;
  Result<wasm::WATParser::Ok> _val_411;
  Result<wasm::WATParser::Ok> ret_411;
  Err *err_410;
  Result<wasm::WATParser::Ok> _val_410;
  Result<wasm::WATParser::Ok> ret_410;
  Err *err_409;
  Result<wasm::WATParser::Ok> _val_409;
  Result<wasm::WATParser::Ok> ret_409;
  Err *err_408;
  Result<wasm::WATParser::Ok> _val_408;
  Result<wasm::WATParser::Ok> ret_408;
  Err *err_407;
  Result<wasm::WATParser::Ok> _val_407;
  Result<wasm::WATParser::Ok> ret_407;
  Err *err_406;
  Result<wasm::WATParser::Ok> _val_406;
  Result<wasm::WATParser::Ok> ret_406;
  Err *err_405;
  Result<wasm::WATParser::Ok> _val_405;
  Result<wasm::WATParser::Ok> ret_405;
  Err *err_404;
  Result<wasm::WATParser::Ok> _val_404;
  Result<wasm::WATParser::Ok> ret_404;
  Err *err_403;
  Result<wasm::WATParser::Ok> _val_403;
  Result<wasm::WATParser::Ok> ret_403;
  Err *err_402;
  Result<wasm::WATParser::Ok> _val_402;
  Result<wasm::WATParser::Ok> ret_402;
  Err *err_401;
  Result<wasm::WATParser::Ok> _val_401;
  Result<wasm::WATParser::Ok> ret_401;
  Err *err_400;
  Result<wasm::WATParser::Ok> _val_400;
  Result<wasm::WATParser::Ok> ret_400;
  Err *err_399;
  Result<wasm::WATParser::Ok> _val_399;
  Result<wasm::WATParser::Ok> ret_399;
  Err *err_398;
  Result<wasm::WATParser::Ok> _val_398;
  Result<wasm::WATParser::Ok> ret_398;
  Err *err_397;
  Result<wasm::WATParser::Ok> _val_397;
  Result<wasm::WATParser::Ok> ret_397;
  Err *err_396;
  Result<wasm::WATParser::Ok> _val_396;
  Result<wasm::WATParser::Ok> ret_396;
  Err *err_395;
  Result<wasm::WATParser::Ok> _val_395;
  Result<wasm::WATParser::Ok> ret_395;
  Err *err_394;
  Result<wasm::WATParser::Ok> _val_394;
  Result<wasm::WATParser::Ok> ret_394;
  Err *err_393;
  Result<wasm::WATParser::Ok> _val_393;
  Result<wasm::WATParser::Ok> ret_393;
  Err *err_392;
  Result<wasm::WATParser::Ok> _val_392;
  Result<wasm::WATParser::Ok> ret_392;
  Err *err_391;
  Result<wasm::WATParser::Ok> _val_391;
  Result<wasm::WATParser::Ok> ret_391;
  Err *err_390;
  Result<wasm::WATParser::Ok> _val_390;
  Result<wasm::WATParser::Ok> ret_390;
  Err *err_389;
  Result<wasm::WATParser::Ok> _val_389;
  Result<wasm::WATParser::Ok> ret_389;
  Err *err_388;
  Result<wasm::WATParser::Ok> _val_388;
  Result<wasm::WATParser::Ok> ret_388;
  Err *err_387;
  Result<wasm::WATParser::Ok> _val_387;
  Result<wasm::WATParser::Ok> ret_387;
  Err *err_386;
  Result<wasm::WATParser::Ok> _val_386;
  Result<wasm::WATParser::Ok> ret_386;
  Err *err_385;
  Result<wasm::WATParser::Ok> _val_385;
  Result<wasm::WATParser::Ok> ret_385;
  Err *err_384;
  Result<wasm::WATParser::Ok> _val_384;
  Result<wasm::WATParser::Ok> ret_384;
  Err *err_383;
  Result<wasm::WATParser::Ok> _val_383;
  Result<wasm::WATParser::Ok> ret_383;
  Err *err_382;
  Result<wasm::WATParser::Ok> _val_382;
  Result<wasm::WATParser::Ok> ret_382;
  Err *err_381;
  Result<wasm::WATParser::Ok> _val_381;
  Result<wasm::WATParser::Ok> ret_381;
  Err *err_380;
  Result<wasm::WATParser::Ok> _val_380;
  Result<wasm::WATParser::Ok> ret_380;
  Err *err_379;
  Result<wasm::WATParser::Ok> _val_379;
  Result<wasm::WATParser::Ok> ret_379;
  Err *err_378;
  Result<wasm::WATParser::Ok> _val_378;
  Result<wasm::WATParser::Ok> ret_378;
  Err *err_377;
  Result<wasm::WATParser::Ok> _val_377;
  Result<wasm::WATParser::Ok> ret_377;
  Err *err_376;
  Result<wasm::WATParser::Ok> _val_376;
  Result<wasm::WATParser::Ok> ret_376;
  Err *err_375;
  Result<wasm::WATParser::Ok> _val_375;
  Result<wasm::WATParser::Ok> ret_375;
  Err *err_374;
  Result<wasm::WATParser::Ok> _val_374;
  Result<wasm::WATParser::Ok> ret_374;
  Err *err_373;
  Result<wasm::WATParser::Ok> _val_373;
  Result<wasm::WATParser::Ok> ret_373;
  Err *err_372;
  Result<wasm::WATParser::Ok> _val_372;
  Result<wasm::WATParser::Ok> ret_372;
  Err *err_371;
  Result<wasm::WATParser::Ok> _val_371;
  Result<wasm::WATParser::Ok> ret_371;
  Err *err_370;
  Result<wasm::WATParser::Ok> _val_370;
  Result<wasm::WATParser::Ok> ret_370;
  Err *err_369;
  Result<wasm::WATParser::Ok> _val_369;
  Result<wasm::WATParser::Ok> ret_369;
  Err *err_368;
  Result<wasm::WATParser::Ok> _val_368;
  Result<wasm::WATParser::Ok> ret_368;
  Err *err_367;
  Result<wasm::WATParser::Ok> _val_367;
  Result<wasm::WATParser::Ok> ret_367;
  Err *err_366;
  Result<wasm::WATParser::Ok> _val_366;
  Result<wasm::WATParser::Ok> ret_366;
  Err *err_365;
  Result<wasm::WATParser::Ok> _val_365;
  Result<wasm::WATParser::Ok> ret_365;
  Err *err_364;
  Result<wasm::WATParser::Ok> _val_364;
  Result<wasm::WATParser::Ok> ret_364;
  Err *err_363;
  Result<wasm::WATParser::Ok> _val_363;
  Result<wasm::WATParser::Ok> ret_363;
  Err *err_362;
  Result<wasm::WATParser::Ok> _val_362;
  Result<wasm::WATParser::Ok> ret_362;
  Err *err_361;
  Result<wasm::WATParser::Ok> _val_361;
  Result<wasm::WATParser::Ok> ret_361;
  Err *err_360;
  Result<wasm::WATParser::Ok> _val_360;
  Result<wasm::WATParser::Ok> ret_360;
  Err *err_359;
  Result<wasm::WATParser::Ok> _val_359;
  Result<wasm::WATParser::Ok> ret_359;
  Err *err_358;
  Result<wasm::WATParser::Ok> _val_358;
  Result<wasm::WATParser::Ok> ret_358;
  Err *err_357;
  Result<wasm::WATParser::Ok> _val_357;
  Result<wasm::WATParser::Ok> ret_357;
  Err *err_356;
  Result<wasm::WATParser::Ok> _val_356;
  Result<wasm::WATParser::Ok> ret_356;
  Err *err_355;
  Result<wasm::WATParser::Ok> _val_355;
  Result<wasm::WATParser::Ok> ret_355;
  Err *err_354;
  Result<wasm::WATParser::Ok> _val_354;
  Result<wasm::WATParser::Ok> ret_354;
  Err *err_353;
  Result<wasm::WATParser::Ok> _val_353;
  Result<wasm::WATParser::Ok> ret_353;
  Err *err_352;
  Result<wasm::WATParser::Ok> _val_352;
  Result<wasm::WATParser::Ok> ret_352;
  Err *err_351;
  Result<wasm::WATParser::Ok> _val_351;
  Result<wasm::WATParser::Ok> ret_351;
  Err *err_350;
  Result<wasm::WATParser::Ok> _val_350;
  Result<wasm::WATParser::Ok> ret_350;
  Err *err_349;
  Result<wasm::WATParser::Ok> _val_349;
  Result<wasm::WATParser::Ok> ret_349;
  Err *err_348;
  Result<wasm::WATParser::Ok> _val_348;
  Result<wasm::WATParser::Ok> ret_348;
  Err *err_347;
  Result<wasm::WATParser::Ok> _val_347;
  Result<wasm::WATParser::Ok> ret_347;
  Err *err_346;
  Result<wasm::WATParser::Ok> _val_346;
  Result<wasm::WATParser::Ok> ret_346;
  Err *err_345;
  Result<wasm::WATParser::Ok> _val_345;
  Result<wasm::WATParser::Ok> ret_345;
  Err *err_344;
  Result<wasm::WATParser::Ok> _val_344;
  Result<wasm::WATParser::Ok> ret_344;
  Err *err_343;
  Result<wasm::WATParser::Ok> _val_343;
  Result<wasm::WATParser::Ok> ret_343;
  Err *err_342;
  Result<wasm::WATParser::Ok> _val_342;
  Result<wasm::WATParser::Ok> ret_342;
  Err *err_341;
  Result<wasm::WATParser::Ok> _val_341;
  Result<wasm::WATParser::Ok> ret_341;
  Err *err_340;
  Result<wasm::WATParser::Ok> _val_340;
  Result<wasm::WATParser::Ok> ret_340;
  Err *err_339;
  Result<wasm::WATParser::Ok> _val_339;
  Result<wasm::WATParser::Ok> ret_339;
  Err *err_338;
  Result<wasm::WATParser::Ok> _val_338;
  Result<wasm::WATParser::Ok> ret_338;
  Err *err_337;
  Result<wasm::WATParser::Ok> _val_337;
  Result<wasm::WATParser::Ok> ret_337;
  Err *err_336;
  Result<wasm::WATParser::Ok> _val_336;
  Result<wasm::WATParser::Ok> ret_336;
  Err *err_335;
  Result<wasm::WATParser::Ok> _val_335;
  Result<wasm::WATParser::Ok> ret_335;
  Err *err_334;
  Result<wasm::WATParser::Ok> _val_334;
  Result<wasm::WATParser::Ok> ret_334;
  Err *err_333;
  Result<wasm::WATParser::Ok> _val_333;
  Result<wasm::WATParser::Ok> ret_333;
  Err *err_332;
  Result<wasm::WATParser::Ok> _val_332;
  Result<wasm::WATParser::Ok> ret_332;
  Err *err_331;
  Result<wasm::WATParser::Ok> _val_331;
  Result<wasm::WATParser::Ok> ret_331;
  Err *err_330;
  Result<wasm::WATParser::Ok> _val_330;
  Result<wasm::WATParser::Ok> ret_330;
  Err *err_329;
  Result<wasm::WATParser::Ok> _val_329;
  Result<wasm::WATParser::Ok> ret_329;
  Err *err_328;
  Result<wasm::WATParser::Ok> _val_328;
  Result<wasm::WATParser::Ok> ret_328;
  Err *err_327;
  Result<wasm::WATParser::Ok> _val_327;
  Result<wasm::WATParser::Ok> ret_327;
  Err *err_326;
  Result<wasm::WATParser::Ok> _val_326;
  Result<wasm::WATParser::Ok> ret_326;
  Err *err_325;
  Result<wasm::WATParser::Ok> _val_325;
  Result<wasm::WATParser::Ok> ret_325;
  Err *err_324;
  Result<wasm::WATParser::Ok> _val_324;
  Result<wasm::WATParser::Ok> ret_324;
  Err *err_323;
  Result<wasm::WATParser::Ok> _val_323;
  Result<wasm::WATParser::Ok> ret_323;
  Err *err_322;
  Result<wasm::WATParser::Ok> _val_322;
  Result<wasm::WATParser::Ok> ret_322;
  Err *err_321;
  Result<wasm::WATParser::Ok> _val_321;
  Result<wasm::WATParser::Ok> ret_321;
  Err *err_320;
  Result<wasm::WATParser::Ok> _val_320;
  Result<wasm::WATParser::Ok> ret_320;
  Err *err_319;
  Result<wasm::WATParser::Ok> _val_319;
  Result<wasm::WATParser::Ok> ret_319;
  Err *err_318;
  Result<wasm::WATParser::Ok> _val_318;
  Result<wasm::WATParser::Ok> ret_318;
  Err *err_317;
  Result<wasm::WATParser::Ok> _val_317;
  Result<wasm::WATParser::Ok> ret_317;
  Err *err_316;
  Result<wasm::WATParser::Ok> _val_316;
  Result<wasm::WATParser::Ok> ret_316;
  Err *err_315;
  Result<wasm::WATParser::Ok> _val_315;
  Result<wasm::WATParser::Ok> ret_315;
  Err *err_314;
  Result<wasm::WATParser::Ok> _val_314;
  Result<wasm::WATParser::Ok> ret_314;
  Err *err_313;
  Result<wasm::WATParser::Ok> _val_313;
  Result<wasm::WATParser::Ok> ret_313;
  Err *err_312;
  Result<wasm::WATParser::Ok> _val_312;
  Result<wasm::WATParser::Ok> ret_312;
  Err *err_311;
  Result<wasm::WATParser::Ok> _val_311;
  Result<wasm::WATParser::Ok> ret_311;
  Err *err_310;
  Result<wasm::WATParser::Ok> _val_310;
  Result<wasm::WATParser::Ok> ret_310;
  Err *err_309;
  Result<wasm::WATParser::Ok> _val_309;
  Result<wasm::WATParser::Ok> ret_309;
  Err *err_308;
  Result<wasm::WATParser::Ok> _val_308;
  Result<wasm::WATParser::Ok> ret_308;
  Err *err_307;
  Result<wasm::WATParser::Ok> _val_307;
  Result<wasm::WATParser::Ok> ret_307;
  Err *err_306;
  Result<wasm::WATParser::Ok> _val_306;
  Result<wasm::WATParser::Ok> ret_306;
  Err *err_305;
  Result<wasm::WATParser::Ok> _val_305;
  Result<wasm::WATParser::Ok> ret_305;
  Err *err_304;
  Result<wasm::WATParser::Ok> _val_304;
  Result<wasm::WATParser::Ok> ret_304;
  Err *err_303;
  Result<wasm::WATParser::Ok> _val_303;
  Result<wasm::WATParser::Ok> ret_303;
  Err *err_302;
  Result<wasm::WATParser::Ok> _val_302;
  Result<wasm::WATParser::Ok> ret_302;
  Err *err_301;
  Result<wasm::WATParser::Ok> _val_301;
  Result<wasm::WATParser::Ok> ret_301;
  Err *err_300;
  Result<wasm::WATParser::Ok> _val_300;
  Result<wasm::WATParser::Ok> ret_300;
  Err *err_299;
  Result<wasm::WATParser::Ok> _val_299;
  Result<wasm::WATParser::Ok> ret_299;
  Err *err_298;
  Result<wasm::WATParser::Ok> _val_298;
  Result<wasm::WATParser::Ok> ret_298;
  Err *err_297;
  Result<wasm::WATParser::Ok> _val_297;
  Result<wasm::WATParser::Ok> ret_297;
  Err *err_296;
  Result<wasm::WATParser::Ok> _val_296;
  Result<wasm::WATParser::Ok> ret_296;
  Err *err_295;
  Result<wasm::WATParser::Ok> _val_295;
  Result<wasm::WATParser::Ok> ret_295;
  Err *err_294;
  Result<wasm::WATParser::Ok> _val_294;
  Result<wasm::WATParser::Ok> ret_294;
  Err *err_293;
  Result<wasm::WATParser::Ok> _val_293;
  Result<wasm::WATParser::Ok> ret_293;
  Err *err_292;
  Result<wasm::WATParser::Ok> _val_292;
  Result<wasm::WATParser::Ok> ret_292;
  Err *err_291;
  Result<wasm::WATParser::Ok> _val_291;
  Result<wasm::WATParser::Ok> ret_291;
  Err *err_290;
  Result<wasm::WATParser::Ok> _val_290;
  Result<wasm::WATParser::Ok> ret_290;
  Err *err_289;
  Result<wasm::WATParser::Ok> _val_289;
  Result<wasm::WATParser::Ok> ret_289;
  Err *err_288;
  Result<wasm::WATParser::Ok> _val_288;
  Result<wasm::WATParser::Ok> ret_288;
  Err *err_287;
  Result<wasm::WATParser::Ok> _val_287;
  Result<wasm::WATParser::Ok> ret_287;
  Err *err_286;
  Result<wasm::WATParser::Ok> _val_286;
  Result<wasm::WATParser::Ok> ret_286;
  Err *err_285;
  Result<wasm::WATParser::Ok> _val_285;
  Result<wasm::WATParser::Ok> ret_285;
  Err *err_284;
  Result<wasm::WATParser::Ok> _val_284;
  Result<wasm::WATParser::Ok> ret_284;
  Err *err_283;
  Result<wasm::WATParser::Ok> _val_283;
  Result<wasm::WATParser::Ok> ret_283;
  Err *err_282;
  Result<wasm::WATParser::Ok> _val_282;
  Result<wasm::WATParser::Ok> ret_282;
  Err *err_281;
  Result<wasm::WATParser::Ok> _val_281;
  Result<wasm::WATParser::Ok> ret_281;
  Err *err_280;
  Result<wasm::WATParser::Ok> _val_280;
  Result<wasm::WATParser::Ok> ret_280;
  Err *err_279;
  Result<wasm::WATParser::Ok> _val_279;
  Result<wasm::WATParser::Ok> ret_279;
  Err *err_278;
  Result<wasm::WATParser::Ok> _val_278;
  Result<wasm::WATParser::Ok> ret_278;
  Err *err_277;
  Result<wasm::WATParser::Ok> _val_277;
  Result<wasm::WATParser::Ok> ret_277;
  Err *err_276;
  Result<wasm::WATParser::Ok> _val_276;
  Result<wasm::WATParser::Ok> ret_276;
  Err *err_275;
  Result<wasm::WATParser::Ok> _val_275;
  Result<wasm::WATParser::Ok> ret_275;
  Err *err_274;
  Result<wasm::WATParser::Ok> _val_274;
  Result<wasm::WATParser::Ok> ret_274;
  Err *err_273;
  Result<wasm::WATParser::Ok> _val_273;
  Result<wasm::WATParser::Ok> ret_273;
  Err *err_272;
  Result<wasm::WATParser::Ok> _val_272;
  Result<wasm::WATParser::Ok> ret_272;
  Err *err_271;
  Result<wasm::WATParser::Ok> _val_271;
  Result<wasm::WATParser::Ok> ret_271;
  Err *err_270;
  Result<wasm::WATParser::Ok> _val_270;
  Result<wasm::WATParser::Ok> ret_270;
  Err *err_269;
  Result<wasm::WATParser::Ok> _val_269;
  Result<wasm::WATParser::Ok> ret_269;
  Err *err_268;
  Result<wasm::WATParser::Ok> _val_268;
  Result<wasm::WATParser::Ok> ret_268;
  Err *err_267;
  Result<wasm::WATParser::Ok> _val_267;
  Result<wasm::WATParser::Ok> ret_267;
  Err *err_266;
  Result<wasm::WATParser::Ok> _val_266;
  Result<wasm::WATParser::Ok> ret_266;
  Err *err_265;
  Result<wasm::WATParser::Ok> _val_265;
  Result<wasm::WATParser::Ok> ret_265;
  Err *err_264;
  Result<wasm::WATParser::Ok> _val_264;
  Result<wasm::WATParser::Ok> ret_264;
  Err *err_263;
  Result<wasm::WATParser::Ok> _val_263;
  Result<wasm::WATParser::Ok> ret_263;
  Err *err_262;
  Result<wasm::WATParser::Ok> _val_262;
  Result<wasm::WATParser::Ok> ret_262;
  Err *err_261;
  Result<wasm::WATParser::Ok> _val_261;
  Result<wasm::WATParser::Ok> ret_261;
  Err *err_260;
  Result<wasm::WATParser::Ok> _val_260;
  Result<wasm::WATParser::Ok> ret_260;
  Err *err_259;
  Result<wasm::WATParser::Ok> _val_259;
  Result<wasm::WATParser::Ok> ret_259;
  Err *err_258;
  Result<wasm::WATParser::Ok> _val_258;
  Result<wasm::WATParser::Ok> ret_258;
  Err *err_257;
  Result<wasm::WATParser::Ok> _val_257;
  Result<wasm::WATParser::Ok> ret_257;
  Err *err_256;
  Result<wasm::WATParser::Ok> _val_256;
  Result<wasm::WATParser::Ok> ret_256;
  Err *err_255;
  Result<wasm::WATParser::Ok> _val_255;
  Result<wasm::WATParser::Ok> ret_255;
  Err *err_254;
  Result<wasm::WATParser::Ok> _val_254;
  Result<wasm::WATParser::Ok> ret_254;
  Err *err_253;
  Result<wasm::WATParser::Ok> _val_253;
  Result<wasm::WATParser::Ok> ret_253;
  Err *err_252;
  Result<wasm::WATParser::Ok> _val_252;
  Result<wasm::WATParser::Ok> ret_252;
  Err *err_251;
  Result<wasm::WATParser::Ok> _val_251;
  Result<wasm::WATParser::Ok> ret_251;
  Err *err_250;
  Result<wasm::WATParser::Ok> _val_250;
  Result<wasm::WATParser::Ok> ret_250;
  Err *err_249;
  Result<wasm::WATParser::Ok> _val_249;
  Result<wasm::WATParser::Ok> ret_249;
  Err *err_248;
  Result<wasm::WATParser::Ok> _val_248;
  Result<wasm::WATParser::Ok> ret_248;
  Err *err_247;
  Result<wasm::WATParser::Ok> _val_247;
  Result<wasm::WATParser::Ok> ret_247;
  Err *err_246;
  Result<wasm::WATParser::Ok> _val_246;
  Result<wasm::WATParser::Ok> ret_246;
  Err *err_245;
  Result<wasm::WATParser::Ok> _val_245;
  Result<wasm::WATParser::Ok> ret_245;
  Err *err_244;
  Result<wasm::WATParser::Ok> _val_244;
  Result<wasm::WATParser::Ok> ret_244;
  Err *err_243;
  Result<wasm::WATParser::Ok> _val_243;
  Result<wasm::WATParser::Ok> ret_243;
  Err *err_242;
  Result<wasm::WATParser::Ok> _val_242;
  Result<wasm::WATParser::Ok> ret_242;
  Err *err_241;
  Result<wasm::WATParser::Ok> _val_241;
  Result<wasm::WATParser::Ok> ret_241;
  Err *err_240;
  Result<wasm::WATParser::Ok> _val_240;
  Result<wasm::WATParser::Ok> ret_240;
  Err *err_239;
  Result<wasm::WATParser::Ok> _val_239;
  Result<wasm::WATParser::Ok> ret_239;
  Err *err_238;
  Result<wasm::WATParser::Ok> _val_238;
  Result<wasm::WATParser::Ok> ret_238;
  Err *err_237;
  Result<wasm::WATParser::Ok> _val_237;
  Result<wasm::WATParser::Ok> ret_237;
  Err *err_236;
  Result<wasm::WATParser::Ok> _val_236;
  Result<wasm::WATParser::Ok> ret_236;
  Err *err_235;
  Result<wasm::WATParser::Ok> _val_235;
  Result<wasm::WATParser::Ok> ret_235;
  Err *err_234;
  Result<wasm::WATParser::Ok> _val_234;
  Result<wasm::WATParser::Ok> ret_234;
  Err *err_233;
  Result<wasm::WATParser::Ok> _val_233;
  Result<wasm::WATParser::Ok> ret_233;
  Err *err_232;
  Result<wasm::WATParser::Ok> _val_232;
  Result<wasm::WATParser::Ok> ret_232;
  Err *err_231;
  Result<wasm::WATParser::Ok> _val_231;
  Result<wasm::WATParser::Ok> ret_231;
  Err *err_230;
  Result<wasm::WATParser::Ok> _val_230;
  Result<wasm::WATParser::Ok> ret_230;
  Err *err_229;
  Result<wasm::WATParser::Ok> _val_229;
  Result<wasm::WATParser::Ok> ret_229;
  Err *err_228;
  Result<wasm::WATParser::Ok> _val_228;
  Result<wasm::WATParser::Ok> ret_228;
  Err *err_227;
  Result<wasm::WATParser::Ok> _val_227;
  Result<wasm::WATParser::Ok> ret_227;
  Err *err_226;
  Result<wasm::WATParser::Ok> _val_226;
  Result<wasm::WATParser::Ok> ret_226;
  Err *err_225;
  Result<wasm::WATParser::Ok> _val_225;
  Result<wasm::WATParser::Ok> ret_225;
  Err *err_224;
  Result<wasm::WATParser::Ok> _val_224;
  Result<wasm::WATParser::Ok> ret_224;
  Err *err_223;
  Result<wasm::WATParser::Ok> _val_223;
  Result<wasm::WATParser::Ok> ret_223;
  Err *err_222;
  Result<wasm::WATParser::Ok> _val_222;
  Result<wasm::WATParser::Ok> ret_222;
  Err *err_221;
  Result<wasm::WATParser::Ok> _val_221;
  Result<wasm::WATParser::Ok> ret_221;
  Err *err_220;
  Result<wasm::WATParser::Ok> _val_220;
  Result<wasm::WATParser::Ok> ret_220;
  Err *err_219;
  Result<wasm::WATParser::Ok> _val_219;
  Result<wasm::WATParser::Ok> ret_219;
  Err *err_218;
  Result<wasm::WATParser::Ok> _val_218;
  Result<wasm::WATParser::Ok> ret_218;
  Err *err_217;
  Result<wasm::WATParser::Ok> _val_217;
  Result<wasm::WATParser::Ok> ret_217;
  Err *err_216;
  Result<wasm::WATParser::Ok> _val_216;
  Result<wasm::WATParser::Ok> ret_216;
  Err *err_215;
  Result<wasm::WATParser::Ok> _val_215;
  Result<wasm::WATParser::Ok> ret_215;
  Err *err_214;
  Result<wasm::WATParser::Ok> _val_214;
  Result<wasm::WATParser::Ok> ret_214;
  Err *err_213;
  Result<wasm::WATParser::Ok> _val_213;
  Result<wasm::WATParser::Ok> ret_213;
  Err *err_212;
  Result<wasm::WATParser::Ok> _val_212;
  Result<wasm::WATParser::Ok> ret_212;
  Err *err_211;
  Result<wasm::WATParser::Ok> _val_211;
  Result<wasm::WATParser::Ok> ret_211;
  Err *err_210;
  Result<wasm::WATParser::Ok> _val_210;
  Result<wasm::WATParser::Ok> ret_210;
  Err *err_209;
  Result<wasm::WATParser::Ok> _val_209;
  Result<wasm::WATParser::Ok> ret_209;
  Err *err_208;
  Result<wasm::WATParser::Ok> _val_208;
  Result<wasm::WATParser::Ok> ret_208;
  Err *err_207;
  Result<wasm::WATParser::Ok> _val_207;
  Result<wasm::WATParser::Ok> ret_207;
  Err *err_206;
  Result<wasm::WATParser::Ok> _val_206;
  Result<wasm::WATParser::Ok> ret_206;
  Err *err_205;
  Result<wasm::WATParser::Ok> _val_205;
  Result<wasm::WATParser::Ok> ret_205;
  Err *err_204;
  Result<wasm::WATParser::Ok> _val_204;
  Result<wasm::WATParser::Ok> ret_204;
  Err *err_203;
  Result<wasm::WATParser::Ok> _val_203;
  Result<wasm::WATParser::Ok> ret_203;
  Err *err_202;
  Result<wasm::WATParser::Ok> _val_202;
  Result<wasm::WATParser::Ok> ret_202;
  Err *err_201;
  Result<wasm::WATParser::Ok> _val_201;
  Result<wasm::WATParser::Ok> ret_201;
  Err *err_200;
  Result<wasm::WATParser::Ok> _val_200;
  Result<wasm::WATParser::Ok> ret_200;
  Err *err_199;
  Result<wasm::WATParser::Ok> _val_199;
  Result<wasm::WATParser::Ok> ret_199;
  Err *err_198;
  Result<wasm::WATParser::Ok> _val_198;
  Result<wasm::WATParser::Ok> ret_198;
  Err *err_197;
  Result<wasm::WATParser::Ok> _val_197;
  Result<wasm::WATParser::Ok> ret_197;
  Err *err_196;
  Result<wasm::WATParser::Ok> _val_196;
  Result<wasm::WATParser::Ok> ret_196;
  Err *err_195;
  Result<wasm::WATParser::Ok> _val_195;
  Result<wasm::WATParser::Ok> ret_195;
  Err *err_194;
  Result<wasm::WATParser::Ok> _val_194;
  Result<wasm::WATParser::Ok> ret_194;
  Err *err_193;
  Result<wasm::WATParser::Ok> _val_193;
  Result<wasm::WATParser::Ok> ret_193;
  Err *err_192;
  Result<wasm::WATParser::Ok> _val_192;
  Result<wasm::WATParser::Ok> ret_192;
  Err *err_191;
  Result<wasm::WATParser::Ok> _val_191;
  Result<wasm::WATParser::Ok> ret_191;
  Err *err_190;
  Result<wasm::WATParser::Ok> _val_190;
  Result<wasm::WATParser::Ok> ret_190;
  Err *err_189;
  Result<wasm::WATParser::Ok> _val_189;
  Result<wasm::WATParser::Ok> ret_189;
  Err *err_188;
  Result<wasm::WATParser::Ok> _val_188;
  Result<wasm::WATParser::Ok> ret_188;
  Err *err_187;
  Result<wasm::WATParser::Ok> _val_187;
  Result<wasm::WATParser::Ok> ret_187;
  Err *err_186;
  Result<wasm::WATParser::Ok> _val_186;
  Result<wasm::WATParser::Ok> ret_186;
  Err *err_185;
  Result<wasm::WATParser::Ok> _val_185;
  Result<wasm::WATParser::Ok> ret_185;
  Err *err_184;
  Result<wasm::WATParser::Ok> _val_184;
  Result<wasm::WATParser::Ok> ret_184;
  Err *err_183;
  Result<wasm::WATParser::Ok> _val_183;
  Result<wasm::WATParser::Ok> ret_183;
  Err *err_182;
  Result<wasm::WATParser::Ok> _val_182;
  Result<wasm::WATParser::Ok> ret_182;
  Err *err_181;
  Result<wasm::WATParser::Ok> _val_181;
  Result<wasm::WATParser::Ok> ret_181;
  Err *err_180;
  Result<wasm::WATParser::Ok> _val_180;
  Result<wasm::WATParser::Ok> ret_180;
  Err *err_179;
  Result<wasm::WATParser::Ok> _val_179;
  Result<wasm::WATParser::Ok> ret_179;
  Err *err_178;
  Result<wasm::WATParser::Ok> _val_178;
  Result<wasm::WATParser::Ok> ret_178;
  Err *err_177;
  Result<wasm::WATParser::Ok> _val_177;
  Result<wasm::WATParser::Ok> ret_177;
  Err *err_176;
  Result<wasm::WATParser::Ok> _val_176;
  Result<wasm::WATParser::Ok> ret_176;
  Err *err_175;
  Result<wasm::WATParser::Ok> _val_175;
  Result<wasm::WATParser::Ok> ret_175;
  Err *err_174;
  Result<wasm::WATParser::Ok> _val_174;
  Result<wasm::WATParser::Ok> ret_174;
  Err *err_173;
  Result<wasm::WATParser::Ok> _val_173;
  Result<wasm::WATParser::Ok> ret_173;
  Err *err_172;
  Result<wasm::WATParser::Ok> _val_172;
  Result<wasm::WATParser::Ok> ret_172;
  Err *err_171;
  Result<wasm::WATParser::Ok> _val_171;
  Result<wasm::WATParser::Ok> ret_171;
  Err *err_170;
  Result<wasm::WATParser::Ok> _val_170;
  Result<wasm::WATParser::Ok> ret_170;
  Err *err_169;
  Result<wasm::WATParser::Ok> _val_169;
  Result<wasm::WATParser::Ok> ret_169;
  Err *err_168;
  Result<wasm::WATParser::Ok> _val_168;
  Result<wasm::WATParser::Ok> ret_168;
  Err *err_167;
  Result<wasm::WATParser::Ok> _val_167;
  Result<wasm::WATParser::Ok> ret_167;
  Err *err_166;
  Result<wasm::WATParser::Ok> _val_166;
  Result<wasm::WATParser::Ok> ret_166;
  Err *err_165;
  Result<wasm::WATParser::Ok> _val_165;
  Result<wasm::WATParser::Ok> ret_165;
  Err *err_164;
  Result<wasm::WATParser::Ok> _val_164;
  Result<wasm::WATParser::Ok> ret_164;
  Err *err_163;
  Result<wasm::WATParser::Ok> _val_163;
  Result<wasm::WATParser::Ok> ret_163;
  Err *err_162;
  Result<wasm::WATParser::Ok> _val_162;
  Result<wasm::WATParser::Ok> ret_162;
  Err *err_161;
  Result<wasm::WATParser::Ok> _val_161;
  Result<wasm::WATParser::Ok> ret_161;
  Err *err_160;
  Result<wasm::WATParser::Ok> _val_160;
  Result<wasm::WATParser::Ok> ret_160;
  Err *err_159;
  Result<wasm::WATParser::Ok> _val_159;
  Result<wasm::WATParser::Ok> ret_159;
  Err *err_158;
  Result<wasm::WATParser::Ok> _val_158;
  Result<wasm::WATParser::Ok> ret_158;
  Err *err_157;
  Result<wasm::WATParser::Ok> _val_157;
  Result<wasm::WATParser::Ok> ret_157;
  Err *err_156;
  Result<wasm::WATParser::Ok> _val_156;
  Result<wasm::WATParser::Ok> ret_156;
  Err *err_155;
  Result<wasm::WATParser::Ok> _val_155;
  Result<wasm::WATParser::Ok> ret_155;
  Err *err_154;
  Result<wasm::WATParser::Ok> _val_154;
  Result<wasm::WATParser::Ok> ret_154;
  Err *err_153;
  Result<wasm::WATParser::Ok> _val_153;
  Result<wasm::WATParser::Ok> ret_153;
  Err *err_152;
  Result<wasm::WATParser::Ok> _val_152;
  Result<wasm::WATParser::Ok> ret_152;
  Err *err_151;
  Result<wasm::WATParser::Ok> _val_151;
  Result<wasm::WATParser::Ok> ret_151;
  Err *err_150;
  Result<wasm::WATParser::Ok> _val_150;
  Result<wasm::WATParser::Ok> ret_150;
  Err *err_149;
  Result<wasm::WATParser::Ok> _val_149;
  Result<wasm::WATParser::Ok> ret_149;
  Err *err_148;
  Result<wasm::WATParser::Ok> _val_148;
  Result<wasm::WATParser::Ok> ret_148;
  Err *err_147;
  Result<wasm::WATParser::Ok> _val_147;
  Result<wasm::WATParser::Ok> ret_147;
  Err *err_146;
  Result<wasm::WATParser::Ok> _val_146;
  Result<wasm::WATParser::Ok> ret_146;
  Err *err_145;
  Result<wasm::WATParser::Ok> _val_145;
  Result<wasm::WATParser::Ok> ret_145;
  Err *err_144;
  Result<wasm::WATParser::Ok> _val_144;
  Result<wasm::WATParser::Ok> ret_144;
  Err *err_143;
  Result<wasm::WATParser::Ok> _val_143;
  Result<wasm::WATParser::Ok> ret_143;
  Err *err_142;
  Result<wasm::WATParser::Ok> _val_142;
  Result<wasm::WATParser::Ok> ret_142;
  Err *err_141;
  Result<wasm::WATParser::Ok> _val_141;
  Result<wasm::WATParser::Ok> ret_141;
  Err *err_140;
  Result<wasm::WATParser::Ok> _val_140;
  Result<wasm::WATParser::Ok> ret_140;
  Err *err_139;
  Result<wasm::WATParser::Ok> _val_139;
  Result<wasm::WATParser::Ok> ret_139;
  Err *err_138;
  Result<wasm::WATParser::Ok> _val_138;
  Result<wasm::WATParser::Ok> ret_138;
  Err *err_137;
  Result<wasm::WATParser::Ok> _val_137;
  Result<wasm::WATParser::Ok> ret_137;
  Err *err_136;
  Result<wasm::WATParser::Ok> _val_136;
  Result<wasm::WATParser::Ok> ret_136;
  Err *err_135;
  Result<wasm::WATParser::Ok> _val_135;
  Result<wasm::WATParser::Ok> ret_135;
  Err *err_134;
  Result<wasm::WATParser::Ok> _val_134;
  Result<wasm::WATParser::Ok> ret_134;
  Err *err_133;
  Result<wasm::WATParser::Ok> _val_133;
  Result<wasm::WATParser::Ok> ret_133;
  Err *err_132;
  Result<wasm::WATParser::Ok> _val_132;
  Result<wasm::WATParser::Ok> ret_132;
  Err *err_131;
  Result<wasm::WATParser::Ok> _val_131;
  Result<wasm::WATParser::Ok> ret_131;
  Err *err_130;
  Result<wasm::WATParser::Ok> _val_130;
  Result<wasm::WATParser::Ok> ret_130;
  Err *err_129;
  Result<wasm::WATParser::Ok> _val_129;
  Result<wasm::WATParser::Ok> ret_129;
  Err *err_128;
  Result<wasm::WATParser::Ok> _val_128;
  Result<wasm::WATParser::Ok> ret_128;
  Err *err_127;
  Result<wasm::WATParser::Ok> _val_127;
  Result<wasm::WATParser::Ok> ret_127;
  Err *err_126;
  Result<wasm::WATParser::Ok> _val_126;
  Result<wasm::WATParser::Ok> ret_126;
  Err *err_125;
  Result<wasm::WATParser::Ok> _val_125;
  Result<wasm::WATParser::Ok> ret_125;
  Err *err_124;
  Result<wasm::WATParser::Ok> _val_124;
  Result<wasm::WATParser::Ok> ret_124;
  Err *err_123;
  Result<wasm::WATParser::Ok> _val_123;
  Result<wasm::WATParser::Ok> ret_123;
  Err *err_122;
  Result<wasm::WATParser::Ok> _val_122;
  Result<wasm::WATParser::Ok> ret_122;
  Err *err_121;
  Result<wasm::WATParser::Ok> _val_121;
  Result<wasm::WATParser::Ok> ret_121;
  Err *err_120;
  Result<wasm::WATParser::Ok> _val_120;
  Result<wasm::WATParser::Ok> ret_120;
  Err *err_119;
  Result<wasm::WATParser::Ok> _val_119;
  Result<wasm::WATParser::Ok> ret_119;
  Err *err_118;
  Result<wasm::WATParser::Ok> _val_118;
  Result<wasm::WATParser::Ok> ret_118;
  Err *err_117;
  Result<wasm::WATParser::Ok> _val_117;
  Result<wasm::WATParser::Ok> ret_117;
  Err *err_116;
  Result<wasm::WATParser::Ok> _val_116;
  Result<wasm::WATParser::Ok> ret_116;
  Err *err_115;
  Result<wasm::WATParser::Ok> _val_115;
  Result<wasm::WATParser::Ok> ret_115;
  Err *err_114;
  Result<wasm::WATParser::Ok> _val_114;
  Result<wasm::WATParser::Ok> ret_114;
  Err *err_113;
  Result<wasm::WATParser::Ok> _val_113;
  Result<wasm::WATParser::Ok> ret_113;
  Err *err_112;
  Result<wasm::WATParser::Ok> _val_112;
  Result<wasm::WATParser::Ok> ret_112;
  Err *err_111;
  Result<wasm::WATParser::Ok> _val_111;
  Result<wasm::WATParser::Ok> ret_111;
  Err *err_110;
  Result<wasm::WATParser::Ok> _val_110;
  Result<wasm::WATParser::Ok> ret_110;
  Err *err_109;
  Result<wasm::WATParser::Ok> _val_109;
  Result<wasm::WATParser::Ok> ret_109;
  Err *err_108;
  Result<wasm::WATParser::Ok> _val_108;
  Result<wasm::WATParser::Ok> ret_108;
  Err *err_107;
  Result<wasm::WATParser::Ok> _val_107;
  Result<wasm::WATParser::Ok> ret_107;
  Err *err_106;
  Result<wasm::WATParser::Ok> _val_106;
  Result<wasm::WATParser::Ok> ret_106;
  Err *err_105;
  Result<wasm::WATParser::Ok> _val_105;
  Result<wasm::WATParser::Ok> ret_105;
  Err *err_104;
  Result<wasm::WATParser::Ok> _val_104;
  Result<wasm::WATParser::Ok> ret_104;
  Err *err_103;
  Result<wasm::WATParser::Ok> _val_103;
  Result<wasm::WATParser::Ok> ret_103;
  Err *err_102;
  Result<wasm::WATParser::Ok> _val_102;
  Result<wasm::WATParser::Ok> ret_102;
  Err *err_101;
  Result<wasm::WATParser::Ok> _val_101;
  Result<wasm::WATParser::Ok> ret_101;
  Err *err_100;
  Result<wasm::WATParser::Ok> _val_100;
  Result<wasm::WATParser::Ok> ret_100;
  Err *err_99;
  Result<wasm::WATParser::Ok> _val_99;
  Result<wasm::WATParser::Ok> ret_99;
  Err *err_98;
  Result<wasm::WATParser::Ok> _val_98;
  Result<wasm::WATParser::Ok> ret_98;
  Err *err_97;
  Result<wasm::WATParser::Ok> _val_97;
  Result<wasm::WATParser::Ok> ret_97;
  Err *err_96;
  Result<wasm::WATParser::Ok> _val_96;
  Result<wasm::WATParser::Ok> ret_96;
  Err *err_95;
  Result<wasm::WATParser::Ok> _val_95;
  Result<wasm::WATParser::Ok> ret_95;
  Err *err_94;
  Result<wasm::WATParser::Ok> _val_94;
  Result<wasm::WATParser::Ok> ret_94;
  Err *err_93;
  Result<wasm::WATParser::Ok> _val_93;
  Result<wasm::WATParser::Ok> ret_93;
  Err *err_92;
  Result<wasm::WATParser::Ok> _val_92;
  Result<wasm::WATParser::Ok> ret_92;
  Err *err_91;
  Result<wasm::WATParser::Ok> _val_91;
  Result<wasm::WATParser::Ok> ret_91;
  Err *err_90;
  Result<wasm::WATParser::Ok> _val_90;
  Result<wasm::WATParser::Ok> ret_90;
  Err *err_89;
  Result<wasm::WATParser::Ok> _val_89;
  Result<wasm::WATParser::Ok> ret_89;
  Err *err_88;
  Result<wasm::WATParser::Ok> _val_88;
  Result<wasm::WATParser::Ok> ret_88;
  Err *err_87;
  Result<wasm::WATParser::Ok> _val_87;
  Result<wasm::WATParser::Ok> ret_87;
  Err *err_86;
  Result<wasm::WATParser::Ok> _val_86;
  Result<wasm::WATParser::Ok> ret_86;
  Err *err_85;
  Result<wasm::WATParser::Ok> _val_85;
  Result<wasm::WATParser::Ok> ret_85;
  Err *err_84;
  Result<wasm::WATParser::Ok> _val_84;
  Result<wasm::WATParser::Ok> ret_84;
  Err *err_83;
  Result<wasm::WATParser::Ok> _val_83;
  Result<wasm::WATParser::Ok> ret_83;
  Err *err_82;
  Result<wasm::WATParser::Ok> _val_82;
  Result<wasm::WATParser::Ok> ret_82;
  Err *err_81;
  Result<wasm::WATParser::Ok> _val_81;
  Result<wasm::WATParser::Ok> ret_81;
  Err *err_80;
  Result<wasm::WATParser::Ok> _val_80;
  Result<wasm::WATParser::Ok> ret_80;
  Err *err_79;
  Result<wasm::WATParser::Ok> _val_79;
  Result<wasm::WATParser::Ok> ret_79;
  Err *err_78;
  Result<wasm::WATParser::Ok> _val_78;
  Result<wasm::WATParser::Ok> ret_78;
  Err *err_77;
  Result<wasm::WATParser::Ok> _val_77;
  Result<wasm::WATParser::Ok> ret_77;
  Err *err_76;
  Result<wasm::WATParser::Ok> _val_76;
  Result<wasm::WATParser::Ok> ret_76;
  Err *err_75;
  Result<wasm::WATParser::Ok> _val_75;
  Result<wasm::WATParser::Ok> ret_75;
  Err *err_74;
  Result<wasm::WATParser::Ok> _val_74;
  Result<wasm::WATParser::Ok> ret_74;
  Err *err_73;
  Result<wasm::WATParser::Ok> _val_73;
  Result<wasm::WATParser::Ok> ret_73;
  Err *err_72;
  Result<wasm::WATParser::Ok> _val_72;
  Result<wasm::WATParser::Ok> ret_72;
  Err *err_71;
  Result<wasm::WATParser::Ok> _val_71;
  Result<wasm::WATParser::Ok> ret_71;
  Err *err_70;
  Result<wasm::WATParser::Ok> _val_70;
  Result<wasm::WATParser::Ok> ret_70;
  Err *err_69;
  Result<wasm::WATParser::Ok> _val_69;
  Result<wasm::WATParser::Ok> ret_69;
  Err *err_68;
  Result<wasm::WATParser::Ok> _val_68;
  Result<wasm::WATParser::Ok> ret_68;
  Err *err_67;
  Result<wasm::WATParser::Ok> _val_67;
  Result<wasm::WATParser::Ok> ret_67;
  Err *err_66;
  Result<wasm::WATParser::Ok> _val_66;
  Result<wasm::WATParser::Ok> ret_66;
  Err *err_65;
  Result<wasm::WATParser::Ok> _val_65;
  Result<wasm::WATParser::Ok> ret_65;
  Err *err_64;
  Result<wasm::WATParser::Ok> _val_64;
  Result<wasm::WATParser::Ok> ret_64;
  Err *err_63;
  Result<wasm::WATParser::Ok> _val_63;
  Result<wasm::WATParser::Ok> ret_63;
  Err *err_62;
  Result<wasm::WATParser::Ok> _val_62;
  Result<wasm::WATParser::Ok> ret_62;
  Err *err_61;
  Result<wasm::WATParser::Ok> _val_61;
  Result<wasm::WATParser::Ok> ret_61;
  Err *err_60;
  Result<wasm::WATParser::Ok> _val_60;
  Result<wasm::WATParser::Ok> ret_60;
  Err *err_59;
  Result<wasm::WATParser::Ok> _val_59;
  Result<wasm::WATParser::Ok> ret_59;
  Err *err_58;
  Result<wasm::WATParser::Ok> _val_58;
  Result<wasm::WATParser::Ok> ret_58;
  Err *err_57;
  Result<wasm::WATParser::Ok> _val_57;
  Result<wasm::WATParser::Ok> ret_57;
  Err *err_56;
  Result<wasm::WATParser::Ok> _val_56;
  Result<wasm::WATParser::Ok> ret_56;
  Err *err_55;
  Result<wasm::WATParser::Ok> _val_55;
  Result<wasm::WATParser::Ok> ret_55;
  Err *err_54;
  Result<wasm::WATParser::Ok> _val_54;
  Result<wasm::WATParser::Ok> ret_54;
  Err *err_53;
  Result<wasm::WATParser::Ok> _val_53;
  Result<wasm::WATParser::Ok> ret_53;
  Err *err_52;
  Result<wasm::WATParser::Ok> _val_52;
  Result<wasm::WATParser::Ok> ret_52;
  Err *err_51;
  Result<wasm::WATParser::Ok> _val_51;
  Result<wasm::WATParser::Ok> ret_51;
  Err *err_50;
  Result<wasm::WATParser::Ok> _val_50;
  Result<wasm::WATParser::Ok> ret_50;
  Err *err_49;
  Result<wasm::WATParser::Ok> _val_49;
  Result<wasm::WATParser::Ok> ret_49;
  Err *err_48;
  Result<wasm::WATParser::Ok> _val_48;
  Result<wasm::WATParser::Ok> ret_48;
  Err *err_47;
  Result<wasm::WATParser::Ok> _val_47;
  Result<wasm::WATParser::Ok> ret_47;
  Err *err_46;
  Result<wasm::WATParser::Ok> _val_46;
  Result<wasm::WATParser::Ok> ret_46;
  Err *err_45;
  Result<wasm::WATParser::Ok> _val_45;
  Result<wasm::WATParser::Ok> ret_45;
  Err *err_44;
  Result<wasm::WATParser::Ok> _val_44;
  Result<wasm::WATParser::Ok> ret_44;
  Err *err_43;
  Result<wasm::WATParser::Ok> _val_43;
  Result<wasm::WATParser::Ok> ret_43;
  Err *err_42;
  Result<wasm::WATParser::Ok> _val_42;
  Result<wasm::WATParser::Ok> ret_42;
  Err *err_41;
  Result<wasm::WATParser::Ok> _val_41;
  Result<wasm::WATParser::Ok> ret_41;
  Err *err_40;
  Result<wasm::WATParser::Ok> _val_40;
  Result<wasm::WATParser::Ok> ret_40;
  Err *err_39;
  Result<wasm::WATParser::Ok> _val_39;
  Result<wasm::WATParser::Ok> ret_39;
  Err *err_38;
  Result<wasm::WATParser::Ok> _val_38;
  Result<wasm::WATParser::Ok> ret_38;
  Err *err_37;
  Result<wasm::WATParser::Ok> _val_37;
  Result<wasm::WATParser::Ok> ret_37;
  Err *err_36;
  Result<wasm::WATParser::Ok> _val_36;
  Result<wasm::WATParser::Ok> ret_36;
  Err *err_35;
  Result<wasm::WATParser::Ok> _val_35;
  Result<wasm::WATParser::Ok> ret_35;
  Err *err_34;
  Result<wasm::WATParser::Ok> _val_34;
  Result<wasm::WATParser::Ok> ret_34;
  Err *err_33;
  Result<wasm::WATParser::Ok> _val_33;
  Result<wasm::WATParser::Ok> ret_33;
  Err *err_32;
  Result<wasm::WATParser::Ok> _val_32;
  Result<wasm::WATParser::Ok> ret_32;
  Err *err_31;
  Result<wasm::WATParser::Ok> _val_31;
  Result<wasm::WATParser::Ok> ret_31;
  Err *err_30;
  Result<wasm::WATParser::Ok> _val_30;
  Result<wasm::WATParser::Ok> ret_30;
  Err *err_29;
  Result<wasm::WATParser::Ok> _val_29;
  Result<wasm::WATParser::Ok> ret_29;
  Err *err_28;
  Result<wasm::WATParser::Ok> _val_28;
  Result<wasm::WATParser::Ok> ret_28;
  Err *err_27;
  Result<wasm::WATParser::Ok> _val_27;
  Result<wasm::WATParser::Ok> ret_27;
  Err *err_26;
  Result<wasm::WATParser::Ok> _val_26;
  Result<wasm::WATParser::Ok> ret_26;
  Err *err_25;
  Result<wasm::WATParser::Ok> _val_25;
  Result<wasm::WATParser::Ok> ret_25;
  Err *err_24;
  Result<wasm::WATParser::Ok> _val_24;
  Result<wasm::WATParser::Ok> ret_24;
  Err *err_23;
  Result<wasm::WATParser::Ok> _val_23;
  Result<wasm::WATParser::Ok> ret_23;
  Err *err_22;
  Result<wasm::WATParser::Ok> _val_22;
  Result<wasm::WATParser::Ok> ret_22;
  Err *err_21;
  Result<wasm::WATParser::Ok> _val_21;
  Result<wasm::WATParser::Ok> ret_21;
  Err *err_20;
  Result<wasm::WATParser::Ok> _val_20;
  Result<wasm::WATParser::Ok> ret_20;
  Err *err_19;
  Result<wasm::WATParser::Ok> _val_19;
  Result<wasm::WATParser::Ok> ret_19;
  Err *err_18;
  Result<wasm::WATParser::Ok> _val_18;
  Result<wasm::WATParser::Ok> ret_18;
  Err *err_17;
  Result<wasm::WATParser::Ok> _val_17;
  Result<wasm::WATParser::Ok> ret_17;
  Err *err_16;
  Result<wasm::WATParser::Ok> _val_16;
  Result<wasm::WATParser::Ok> ret_16;
  Err *err_15;
  Result<wasm::WATParser::Ok> _val_15;
  Result<wasm::WATParser::Ok> ret_15;
  Err *err_14;
  Result<wasm::WATParser::Ok> _val_14;
  Result<wasm::WATParser::Ok> ret_14;
  Err *err_13;
  Result<wasm::WATParser::Ok> _val_13;
  Result<wasm::WATParser::Ok> ret_13;
  Err *err_12;
  Result<wasm::WATParser::Ok> _val_12;
  Result<wasm::WATParser::Ok> ret_12;
  Err *err_11;
  Result<wasm::WATParser::Ok> _val_11;
  Result<wasm::WATParser::Ok> ret_11;
  Err *err_10;
  Result<wasm::WATParser::Ok> _val_10;
  Result<wasm::WATParser::Ok> ret_10;
  Err *err_9;
  Result<wasm::WATParser::Ok> _val_9;
  Result<wasm::WATParser::Ok> ret_9;
  Err *err_8;
  Result<wasm::WATParser::Ok> _val_8;
  Result<wasm::WATParser::Ok> ret_8;
  Err *err_7;
  Result<wasm::WATParser::Ok> _val_7;
  Result<wasm::WATParser::Ok> ret_7;
  Err *err_6;
  Result<wasm::WATParser::Ok> _val_6;
  Result<wasm::WATParser::Ok> ret_6;
  Err *err_5;
  Result<wasm::WATParser::Ok> _val_5;
  Result<wasm::WATParser::Ok> ret_5;
  Err *err_4;
  Result<wasm::WATParser::Ok> _val_4;
  Result<wasm::WATParser::Ok> ret_4;
  Err *err_3;
  Result<wasm::WATParser::Ok> _val_3;
  Result<wasm::WATParser::Ok> ret_3;
  Err *err_2;
  Result<wasm::WATParser::Ok> _val_2;
  Result<wasm::WATParser::Ok> ret_2;
  Err *err_1;
  Result<wasm::WATParser::Ok> _val_1;
  Result<wasm::WATParser::Ok> ret_1;
  Err *err;
  Result<wasm::WATParser::Ok> _val;
  Result<wasm::WATParser::Ok> ret;
  undefined8 uStack_78;
  char buf [33];
  undefined1 auStack_48 [8];
  basic_string_view<char,_std::char_traits<char>_> op;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> keyword;
  Index pos;
  ParseModuleTypesCtx *ctx_local;
  
  pos_00 = ParseInput::getPos(&ctx->in);
  ParseInput::takeKeyword
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&op._M_str,&ctx->in
            );
  bVar1 = std::optional::operator_cast_to_bool((optional *)&op._M_str);
  if (bVar1) {
    pbVar2 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                       ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        &op._M_str);
    auStack_48 = (undefined1  [8])pbVar2->_M_len;
    op._M_len = (size_t)pbVar2->_M_str;
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    uStack_78 = 0;
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[0x18] = '\0';
    __src = std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_48);
    __n = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_48);
    memcpy(&uStack_78,__src,__n);
    if ((int)(char)uStack_78 - 0x61U < 0x16) {
      pMVar3 = (MaybeResult<wasm::WATParser::Ok> *)
               (*(code *)(&DAT_021584f4 +
                         *(int *)(&DAT_021584f4 + (ulong)((int)(char)uStack_78 - 0x61U) * 4)))();
      return pMVar3;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_16e88,"unrecognized instruction",&aStack_16e89);
    ParseInput::err(aEStack_16e68,&ctx->in,pos_00,&sStack_16e88);
    MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__,aEStack_16e68);
    WATParser::Err::~Err(aEStack_16e68);
    std::__cxx11::string::~string((string *)&sStack_16e88);
    std::allocator<char>::~allocator(&aStack_16e89);
  }
  else {
    MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::InstrT> plaininstr(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  auto keyword = ctx.in.takeKeyword();
  if (!keyword) {
    return {};
  }

#define NEW_INSTRUCTION_PARSER
#define NEW_WAT_PARSER
#include <gen-s-parser.inc>
}